

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O2

void __thiscall ImgfsFile::markchunk(ImgfsFile *this,uint64_t ofs,uint size,chunktype_t type)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar4;
  __normal_iterator<ImgfsFile::chunktype_t_*,_std::vector<ImgfsFile::chunktype_t,_std::allocator<ImgfsFile::chunktype_t>_>_>
  _Var5;
  undefined4 extraout_var_01;
  string *__return_storage_ptr__;
  undefined8 *puVar6;
  ulong uVar7;
  __normal_iterator<ImgfsFile::chunktype_t_*,_std::vector<ImgfsFile::chunktype_t,_std::allocator<ImgfsFile::chunktype_t>_>_>
  __last;
  ulong __new_size;
  uint uVar8;
  __normal_iterator<ImgfsFile::chunktype_t_*,_std::vector<ImgfsFile::chunktype_t,_std::allocator<ImgfsFile::chunktype_t>_>_>
  __first;
  chunktype_t type_local;
  uint64_t local_58;
  string str;
  pointer pcVar9;
  
  type_local = type;
  if (size == 0) {
    __return_storage_ptr__ = (string *)__cxa_allocate_exception(0x20);
    stringformat_abi_cxx11_
              (__return_storage_ptr__,"can\'t mark empty chunk @%08llx, \'%c\'",ofs,
               (ulong)(uint)(int)(char)type);
  }
  else {
    iVar3 = (*((this->_rd).super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              _vptr_ReadWriter[6])();
    if (ofs < CONCAT44(extraout_var,iVar3)) {
      iVar3 = (*((this->_rd).super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                _vptr_ReadWriter[6])();
      if (size + ofs <= CONCAT44(extraout_var_00,iVar3)) {
        uVar8 = (this->_hdr).bytesperchunk;
        uVar7 = CONCAT44(0,uVar8);
        auVar1._8_8_ = 0;
        auVar1._0_8_ = uVar7;
        auVar2._8_8_ = 0;
        auVar2._0_8_ = ofs;
        uVar4 = SUB168(auVar2 / auVar1,0);
        if (ofs % uVar7 == 0) {
          local_58 = ofs;
          if (uVar4 >> 0x20 == 0) {
            uVar8 = (uVar8 - 1 | size - 1) + 1;
            uVar7 = uVar8 / uVar7;
            pcVar9 = (this->_chunkmap).
                     super__Vector_base<ImgfsFile::chunktype_t,_std::allocator<ImgfsFile::chunktype_t>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            __new_size = (ulong)(uint)((int)uVar7 + SUB164(auVar2 / auVar1,0));
            if ((ulong)((long)(this->_chunkmap).
                              super__Vector_base<ImgfsFile::chunktype_t,_std::allocator<ImgfsFile::chunktype_t>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pcVar9) <
                __new_size) {
              str._M_dataplus._M_p._0_1_ = 0x20;
              std::vector<ImgfsFile::chunktype_t,_std::allocator<ImgfsFile::chunktype_t>_>::resize
                        (&this->_chunkmap,__new_size,(value_type *)&str);
              pcVar9 = (this->_chunkmap).
                       super__Vector_base<ImgfsFile::chunktype_t,_std::allocator<ImgfsFile::chunktype_t>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            }
            __first._M_current = pcVar9 + uVar4;
            if (type != FREECHUNK) {
              __last._M_current = __first._M_current + uVar7;
              _Var5 = std::
                      __find_if<__gnu_cxx::__normal_iterator<ImgfsFile::chunktype_t*,std::vector<ImgfsFile::chunktype_t,std::allocator<ImgfsFile::chunktype_t>>>,__gnu_cxx::__ops::_Iter_pred<ImgfsFile::markchunk(unsigned_long,unsigned_int,ImgfsFile::chunktype_t)::_lambda(ImgfsFile::chunktype_t)_1_>>
                                (__first._M_current,__last._M_current);
              if (_Var5._M_current != __last._M_current) {
                printf("markchunk, n=%d, type=%c\n",uVar7,(ulong)(uint)(int)(char)type_local);
                str._M_dataplus._M_p = (pointer)&str.field_2;
                str._M_string_length = 0;
                str.field_2._M_local_buf[0] = '\0';
                std::
                for_each<__gnu_cxx::__normal_iterator<ImgfsFile::chunktype_t*,std::vector<ImgfsFile::chunktype_t,std::allocator<ImgfsFile::chunktype_t>>>,ImgfsFile::markchunk(unsigned_long,unsigned_int,ImgfsFile::chunktype_t)::_lambda(ImgfsFile::chunktype_t)_2_>
                          (__first,__last,&str);
                printf("chunk %08llx+%08x is already: \'%s\'\n",local_58,(ulong)uVar8,
                       str._M_dataplus._M_p);
                std::__cxx11::string::~string((string *)&str);
              }
            }
            std::
            __fill_n_a<__gnu_cxx::__normal_iterator<ImgfsFile::chunktype_t*,std::vector<ImgfsFile::chunktype_t,std::allocator<ImgfsFile::chunktype_t>>>,unsigned_int,ImgfsFile::chunktype_t>
                      (__first._M_current,uVar7,&type_local);
            return;
          }
          puVar6 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar6 = "markchunk: offset too large";
          __cxa_throw(puVar6,&char_const*::typeinfo,0);
        }
        __return_storage_ptr__ = (string *)__cxa_allocate_exception(0x20);
        stringformat_abi_cxx11_(__return_storage_ptr__,"unaligned chunk @%08llx",ofs);
        goto LAB_0011f1a1;
      }
    }
    __return_storage_ptr__ = (string *)__cxa_allocate_exception(0x20);
    iVar3 = (*((this->_rd).super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              _vptr_ReadWriter[6])();
    stringformat_abi_cxx11_
              (__return_storage_ptr__,"chunk @%08llx+%08x outside of file [filesize=%llx]",ofs,
               (ulong)size,CONCAT44(extraout_var_01,iVar3));
  }
LAB_0011f1a1:
  __cxa_throw(__return_storage_ptr__,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
}

Assistant:

void markchunk(uint64_t ofs, unsigned size, chunktype_t type)
    {
        if (size==0)
            throw stringformat("can't mark empty chunk @%08llx, '%c'", ofs, type);
        if (ofs>=_rd->size() || ofs+size > _rd->size())
            throw stringformat("chunk @%08llx+%08x outside of file [filesize=%llx]", ofs, size, _rd->size());
        if (ofs%_hdr.bytesperchunk)
            throw stringformat("unaligned chunk @%08llx", ofs);

        size= roundtochunk(size);

        if ((ofs/_hdr.bytesperchunk)>>32)
            throw "markchunk: offset too large";
        unsigned ix= unsigned(ofs/_hdr.bytesperchunk);
        unsigned n= size/_hdr.bytesperchunk;
        if (_chunkmap.size()<ix+n)
            _chunkmap.resize(ix+n, FREECHUNK);

        chunkmap_t::iterator begin= _chunkmap.begin()+ix;
        chunkmap_t::iterator end= _chunkmap.begin()+ix+n;

        // note: msvc10 requires the explicit class scope ImgfsFile  for FREECHUNK
        if (type!=FREECHUNK && std::find_if(begin, end, [](chunktype_t t) { return t!=ImgfsFile::FREECHUNK; })!=end) {
            printf("markchunk, n=%d, type=%c\n", n, type);
            std::string str;
            std::for_each(begin, end, [&str](chunktype_t t){ str += (char)t; });
            printf("chunk %08llx+%08x is already: '%s'\n", ofs, size, str.c_str());

            // is 'str' correct, while the string below is not,
            //    -> because i did not declare the enum as ':char'
            //printf("chunk %08llx+%08x is already: '%s'\n", ofs, size, std::string((const char*)&(*begin), n).c_str());
        }
        std::fill_n(begin, n, type);
    }